

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall
Am_Object_Data::remove_subconstraint(Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *proto)

{
  bool bVar1;
  int iVar2;
  Am_Slot_Data *in_data;
  Am_Constraint *proto_00;
  undefined4 extraout_var;
  Am_Slot local_58;
  Am_Slot local_50;
  undefined1 local_48 [8];
  Am_Constraint_Iterator iter;
  Am_Constraint_Tag tag;
  Am_Constraint *constraint;
  Am_Slot_Data *slot;
  Am_Constraint *proto_local;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  in_data = find_slot(this,key);
  if ((in_data != (Am_Slot_Data *)0x0) && (in_data->context == this)) {
    Am_Slot::Am_Slot(&local_50,in_data);
    Am_Constraint_Iterator::Am_Constraint_Iterator((Am_Constraint_Iterator *)local_48,&local_50);
    Am_Constraint_Iterator::Start((Am_Constraint_Iterator *)local_48);
    while (bVar1 = Am_Constraint_Iterator::Last((Am_Constraint_Iterator *)local_48),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      proto_00 = Am_Constraint_Iterator::Get((Am_Constraint_Iterator *)local_48);
      iter.current = (Am_Constraint_Iterator_Data *)
                     Am_Constraint_Iterator::Get_Tag((Am_Constraint_Iterator *)local_48);
      Am_Constraint_Iterator::Next((Am_Constraint_Iterator *)local_48);
      iVar2 = (*(proto_00->super_Am_Registered_Type)._vptr_Am_Registered_Type[10])();
      if ((Am_Constraint *)CONCAT44(extraout_var,iVar2) == proto) {
        if ((*(ushort *)&in_data->field_0x38 >> 8 & 3) == 1) {
          prop_remove_constraint(this,key,proto_00);
        }
        Am_Slot::Am_Slot(&local_58,in_data);
        Am_Slot::Remove_Constraint(&local_58,iter.current);
      }
    }
  }
  return;
}

Assistant:

void
Am_Object_Data::remove_subconstraint(Am_Slot_Key key, Am_Constraint *proto)
{
  Am_Slot_Data *slot = find_slot(key);
  if (slot && slot->context == this) {
    Am_Constraint *constraint;
    Am_Constraint_Tag tag;
    Am_Constraint_Iterator iter((const Am_Slot &)slot);
    iter.Start();
    while (!iter.Last()) {
      constraint = iter.Get();
      tag = iter.Get_Tag();
      iter.Next();
      if (constraint->Get_Prototype() == proto) {
        if (slot->rule == Am_INHERIT)
          prop_remove_constraint(key, constraint);
        Am_Slot(slot).Remove_Constraint(tag);
      }
    }
  }
}